

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O2

void __thiscall pele::physics::reactions::ReactorCvode::checkCvodeOptions(ReactorCvode *this)

{
  int *piVar1;
  ostringstream *poVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  Context *pCVar6;
  SUNMatrix p_Var7;
  sunindextype *psVar8;
  sunindextype *psVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  ulong uVar15;
  int j;
  int iVar16;
  int HP;
  long local_268;
  sunindextype *local_260;
  sunindextype *local_258;
  string prec_type_str;
  string solve_type_str;
  Print local_210;
  ParmParse ppcv;
  
  if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose)
  {
    poVar5 = amrex::OutStream();
    amrex::Print::Print(&local_210,poVar5);
    poVar2 = &local_210.ss;
    std::operator<<((ostream *)poVar2,"Number of species in mech is ");
    std::ostream::operator<<(poVar2,0x15);
    std::operator<<((ostream *)poVar2,"\n");
    amrex::Print::~Print(&local_210);
  }
  std::__cxx11::string::string((string *)&solve_type_str,"none",(allocator *)&local_210);
  std::__cxx11::string::string((string *)&local_210,"cvode",(allocator *)&prec_type_str);
  amrex::ParmParse::ParmParse(&ppcv,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  amrex::ParmParse::query(&ppcv,"solve_type",&solve_type_str,0);
  bVar4 = std::operator==(&solve_type_str,"fixed_point");
  if (bVar4) {
    if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose < 1
       ) goto LAB_001b2dde;
    poVar5 = amrex::OutStream();
    amrex::Print::Print(&local_210,poVar5);
    std::operator<<((ostream *)&local_210.ss," Using a fixed-point nonlinear solver\n");
  }
  else {
    bVar4 = std::operator==(&solve_type_str,"dense_direct");
    if (bVar4) {
      if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose <
          1) goto LAB_001b2dde;
      poVar5 = amrex::OutStream();
      amrex::Print::Print(&local_210,poVar5);
      std::operator<<((ostream *)&local_210.ss,
                      " Using a dense direct linear solve with Finite Difference Jacobian\n");
    }
    else {
      bVar4 = std::operator==(&solve_type_str,"denseAJ_direct");
      if (bVar4) {
        if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
                verbose) {
          poVar5 = amrex::OutStream();
          amrex::Print::Print(&local_210,poVar5);
          std::operator<<((ostream *)&local_210.ss,
                          " Using a dense direct linear solve with Analytical Jacobian\n");
          amrex::Print::~Print(&local_210);
        }
        bVar4 = false;
LAB_001b2cd3:
        bVar3 = false;
      }
      else {
        bVar4 = std::operator==(&solve_type_str,"sparse_direct");
        if (!bVar4) {
          bVar4 = std::operator==(&solve_type_str,"custom_direct");
          if (!bVar4) {
            bVar4 = std::operator==(&solve_type_str,"GMRES");
            if (bVar4) {
              if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
                  verbose < 1) goto LAB_001b2dde;
              poVar5 = amrex::OutStream();
              amrex::Print::Print(&local_210,poVar5);
              std::operator<<((ostream *)&local_210.ss," Using a JFNK GMRES linear solve\n");
            }
            else {
              bVar4 = std::operator==(&solve_type_str,"precGMRES");
              if (!bVar4) {
                bVar4 = std::operator==(&solve_type_str,"diagnostic");
                if (bVar4) {
                  prec_type_str._M_dataplus._M_p._0_4_ = (uint)(this->m_reactor_type == 2);
                  HP = 0;
                  SPARSITY_INFO(&HP,(int *)&prec_type_str,1);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2,"--> Chem. Jac -- non zero entries: ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2,", which represents ");
                  std::ostream::_M_insert<double>(((double)HP / 484.0) * 100.0);
                  std::operator<<((ostream *)poVar2," % fill-in pattern\n");
                  amrex::Print::~Print(&local_210);
                  iVar12 = HP;
                  pCVar6 = amrex::sundials::The_Sundials_Context(0);
                  p_Var7 = SUNSparseMatrix(0x16,0x16,iVar12,1,
                                           *(pCVar6->sunctx_)._M_t.
                                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                            .super__Head_base<0UL,__SUNContext_**,_false>.
                                            _M_head_impl);
                  psVar8 = SUNSparseMatrix_IndexPointers(p_Var7);
                  psVar9 = SUNSparseMatrix_IndexValues(p_Var7);
                  SPARSITY_PREPROC_CSR(psVar9,psVar8,(int *)&prec_type_str,1,0);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  local_258 = psVar9;
                  std::operator<<((ostream *)&local_210.ss,
                                  "\n\n *** Treating CHEM Jac (CSR symbolic analysis)*** \n\n");
                  amrex::Print::~Print(&local_210);
                  iVar12 = 0;
                  lVar11 = 0;
                  local_260 = psVar8;
                  while (psVar8 = local_260, lVar11 != 0x16) {
                    uVar15 = (long)local_260[lVar11 + 1] - (long)local_260[lVar11];
                    sVar13 = uVar15 * 4;
                    if ((int)uVar15 < 0) {
                      sVar13 = 0xffffffffffffffff;
                    }
                    local_268 = lVar11;
                    pvVar10 = operator_new__(sVar13);
                    local_210.rank = -1;
                    std::__fill_n_a<int*,int,int>(pvVar10,uVar15 & 0xffffffff,&local_210);
                    piVar1 = psVar8 + local_268;
                    local_268 = local_268 + 1;
                    memcpy(pvVar10,local_258 + *piVar1,uVar15 * 4);
                    iVar14 = 0;
                    for (iVar16 = 0; iVar16 != 0x16; iVar16 = iVar16 + 1) {
                      if (((int)uVar15 < 1) ||
                         (iVar16 != *(int *)((long)pvVar10 + (long)iVar14 * 4))) {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0);
                        std::operator<<(poVar5," ");
                      }
                      else {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,1);
                        std::operator<<(poVar5," ");
                        iVar14 = iVar14 + 1;
                        iVar12 = iVar12 + 1;
                      }
                    }
                    operator_delete__(pvVar10);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    lVar11 = local_268;
                  }
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2," There was ");
                  std::ostream::operator<<(poVar2,iVar12);
                  std::operator<<((ostream *)poVar2," non zero elems (compared to the ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2," we need) \n");
                  amrex::Print::~Print(&local_210);
                  SPARSITY_INFO_SYST(&HP,(int *)&prec_type_str,1);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2,"--> Syst. Jac -- non zero entries: ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2,", which represents ");
                  std::ostream::_M_insert<double>(((double)HP / 484.0) * 100.0);
                  std::operator<<((ostream *)poVar2," % fill-in pattern\n");
                  amrex::Print::~Print(&local_210);
                  iVar12 = HP;
                  pCVar6 = amrex::sundials::The_Sundials_Context(0);
                  p_Var7 = SUNSparseMatrix(0x16,0x16,iVar12,1,
                                           *(pCVar6->sunctx_)._M_t.
                                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                            .super__Head_base<0UL,__SUNContext_**,_false>.
                                            _M_head_impl);
                  psVar8 = SUNSparseMatrix_IndexPointers(p_Var7);
                  psVar9 = SUNSparseMatrix_IndexValues(p_Var7);
                  SPARSITY_PREPROC_SYST_CSR(psVar9,psVar8,(int *)&prec_type_str,1,1);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  std::operator<<((ostream *)&local_210.ss,
                                  "\n\n *** Treating SYST Jac (CSR symbolic analysis)*** \n\n");
                  amrex::Print::~Print(&local_210);
                  local_258 = psVar9 + -1;
                  iVar12 = 0;
                  lVar11 = 0;
                  local_260 = psVar8;
                  while (psVar8 = local_260, lVar11 != 0x16) {
                    uVar15 = (long)local_260[lVar11 + 1] - (long)local_260[lVar11];
                    sVar13 = uVar15 * 4;
                    if ((int)uVar15 < 0) {
                      sVar13 = 0xffffffffffffffff;
                    }
                    local_268 = lVar11;
                    pvVar10 = operator_new__(sVar13);
                    local_210.rank = -1;
                    std::__fill_n_a<int*,int,int>(pvVar10,uVar15 & 0xffffffff,&local_210);
                    piVar1 = psVar8 + local_268;
                    local_268 = local_268 + 1;
                    memcpy(pvVar10,local_258 + *piVar1,uVar15 * 4);
                    iVar14 = 0;
                    for (iVar16 = 0; iVar16 != 0x16; iVar16 = iVar16 + 1) {
                      if ((iVar16 == *(int *)((long)pvVar10 + (long)iVar14 * 4) + -1) &&
                         (iVar14 < (int)uVar15)) {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,1);
                        std::operator<<(poVar5," ");
                        iVar14 = iVar14 + 1;
                        iVar12 = iVar12 + 1;
                      }
                      else {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0);
                        std::operator<<(poVar5," ");
                      }
                    }
                    operator_delete__(pvVar10);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    lVar11 = local_268;
                  }
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2," There was ");
                  std::ostream::operator<<(poVar2,iVar12);
                  std::operator<<((ostream *)poVar2," non zero elems (compared to the ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2," we need) \n");
                  amrex::Print::~Print(&local_210);
                  SPARSITY_INFO_SYST_SIMPLIFIED(&HP,(int *)&prec_type_str);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2,
                                  "--> Simplified Syst Jac (for Precond) -- non zero entries: ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2,", which represents ");
                  std::ostream::_M_insert<double>(((double)HP / 484.0) * 100.0);
                  std::operator<<((ostream *)poVar2," % fill-in pattern\n");
                  amrex::Print::~Print(&local_210);
                  iVar12 = HP;
                  pCVar6 = amrex::sundials::The_Sundials_Context(0);
                  p_Var7 = SUNSparseMatrix(0x16,0x16,iVar12,1,
                                           *(pCVar6->sunctx_)._M_t.
                                            super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                            .super__Head_base<0UL,__SUNContext_**,_false>.
                                            _M_head_impl);
                  psVar8 = SUNSparseMatrix_IndexPointers(p_Var7);
                  psVar9 = SUNSparseMatrix_IndexValues(p_Var7);
                  SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(psVar9,psVar8,(int *)&prec_type_str,1);
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  std::operator<<((ostream *)&local_210.ss,
                                  "\n\n *** Treating simplified SYST Jac (CSR symbolic analysis)*** \n\n"
                                 );
                  amrex::Print::~Print(&local_210);
                  local_258 = psVar9 + -1;
                  iVar12 = 0;
                  lVar11 = 0;
                  local_260 = psVar8;
                  while (psVar8 = local_260, lVar11 != 0x16) {
                    uVar15 = (long)local_260[lVar11 + 1] - (long)local_260[lVar11];
                    sVar13 = uVar15 * 4;
                    if ((int)uVar15 < 0) {
                      sVar13 = 0xffffffffffffffff;
                    }
                    local_268 = lVar11;
                    pvVar10 = operator_new__(sVar13);
                    local_210.rank = -1;
                    std::__fill_n_a<int*,int,int>(pvVar10,uVar15 & 0xffffffff,&local_210);
                    piVar1 = psVar8 + local_268;
                    local_268 = local_268 + 1;
                    memcpy(pvVar10,local_258 + *piVar1,uVar15 * 4);
                    iVar14 = 0;
                    for (iVar16 = 0; iVar16 != 0x16; iVar16 = iVar16 + 1) {
                      if ((iVar16 == *(int *)((long)pvVar10 + (long)iVar14 * 4) + -1) &&
                         (iVar14 < (int)uVar15)) {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,1);
                        std::operator<<(poVar5," ");
                        iVar14 = iVar14 + 1;
                        iVar12 = iVar12 + 1;
                      }
                      else {
                        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,0);
                        std::operator<<(poVar5," ");
                      }
                    }
                    operator_delete__(pvVar10);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    lVar11 = local_268;
                  }
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  poVar2 = &local_210.ss;
                  std::operator<<((ostream *)poVar2," There was ");
                  std::ostream::operator<<(poVar2,iVar12);
                  std::operator<<((ostream *)poVar2," non zero elems (compared to the ");
                  std::ostream::operator<<(poVar2,HP);
                  std::operator<<((ostream *)poVar2," we need) \n");
                  amrex::Print::~Print(&local_210);
                  amrex::Abort_host("Chemistry sparsity pattern dumped -> exiting now !");
                }
                else {
                  amrex::Abort_host(
                                   "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
                                   );
                }
                goto LAB_001b2dde;
              }
              if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).
                      super_ReactorBase.verbose) {
                poVar5 = amrex::OutStream();
                amrex::Print::Print(&local_210,poVar5);
                std::operator<<((ostream *)&local_210.ss," Using a JFNK GMRES linear solve");
                amrex::Print::~Print(&local_210);
              }
              std::__cxx11::string::string((string *)&prec_type_str,"none",(allocator *)&local_210);
              amrex::ParmParse::query(&ppcv,"precond_type",&prec_type_str,0);
              bVar4 = std::operator==(&prec_type_str,"dense_simplified_AJacobian");
              if (bVar4) {
                poVar5 = amrex::OutStream();
                amrex::Print::Print(&local_210,poVar5);
                std::operator<<((ostream *)&local_210.ss,
                                " with a dense simplified AJ-based preconditioner");
                amrex::Print::~Print(&local_210);
                iVar12 = 0;
              }
              else {
                bVar4 = std::operator==(&prec_type_str,"sparse_simplified_AJacobian");
                if (bVar4) {
                  amrex::Abort_host(
                                   "precond_type sparse_simplified_AJacobian requires the KLU library"
                                   );
                  poVar5 = amrex::OutStream();
                  amrex::Print::Print(&local_210,poVar5);
                  std::operator<<((ostream *)&local_210.ss,
                                  " with a sparse simplified AJ-based preconditioner");
                  iVar12 = 1;
                  amrex::Print::~Print(&local_210);
                }
                else {
                  bVar4 = std::operator==(&prec_type_str,"custom_simplified_AJacobian");
                  if (bVar4) {
                    poVar5 = amrex::OutStream();
                    amrex::Print::Print(&local_210,poVar5);
                    std::operator<<((ostream *)&local_210.ss,
                                    " with a custom simplified AJ-based preconditioner");
                    amrex::Print::~Print(&local_210);
                    iVar12 = 2;
                  }
                  else {
                    amrex::Abort_host(
                                     "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
                                     );
                    iVar12 = -1;
                  }
                }
              }
              poVar5 = amrex::OutStream();
              amrex::Print::Print(&local_210,poVar5);
              std::operator<<((ostream *)&local_210.ss,"\n");
              amrex::Print::~Print(&local_210);
              std::__cxx11::string::~string((string *)&prec_type_str);
              if (iVar12 == 2) {
                HP = (int)(this->m_reactor_type == 2);
                SPARSITY_INFO_SYST_SIMPLIFIED((int *)&prec_type_str,&HP);
                if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase
                    .verbose < 1) goto LAB_001b2dde;
                poVar5 = amrex::OutStream();
                amrex::Print::Print(&local_210,poVar5);
                poVar2 = &local_210.ss;
                std::operator<<((ostream *)poVar2,
                                "--> custom sparse AJ based matrix Preconditioner -- non zero entries: "
                               );
                std::ostream::operator<<(poVar2,(uint)prec_type_str._M_dataplus._M_p);
                std::operator<<((ostream *)poVar2,", which represents ");
                std::ostream::_M_insert<double>
                          (((double)(int)(uint)prec_type_str._M_dataplus._M_p / 484.0) * 100.0);
                std::operator<<((ostream *)poVar2," % fill-in pattern\n");
              }
              else {
                if (iVar12 != 1) goto LAB_001b2dde;
                HP = (int)(this->m_reactor_type == 2);
                SPARSITY_INFO_SYST_SIMPLIFIED((int *)&prec_type_str,&HP);
                if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase
                    .verbose < 1) goto LAB_001b2dde;
                poVar5 = amrex::OutStream();
                amrex::Print::Print(&local_210,poVar5);
                poVar2 = &local_210.ss;
                std::operator<<((ostream *)poVar2,
                                "--> KLU sparse AJ based matrix Preconditioner -- non zero entries: "
                               );
                std::ostream::operator<<(poVar2,(uint)prec_type_str._M_dataplus._M_p);
                std::operator<<((ostream *)poVar2,", which represents ");
                std::ostream::_M_insert<double>
                          (((double)(int)(uint)prec_type_str._M_dataplus._M_p / 484.0) * 100.0);
                std::operator<<((ostream *)poVar2," % fill-in pattern\n");
              }
            }
            goto LAB_001b2dd4;
          }
          bVar4 = true;
          if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
                  verbose) {
            poVar5 = amrex::OutStream();
            amrex::Print::Print(&local_210,poVar5);
            std::operator<<((ostream *)&local_210.ss,
                            " Using a sparse custom direct linear solve with Analytical Jacobian\n")
            ;
            amrex::Print::~Print(&local_210);
          }
          goto LAB_001b2cd3;
        }
        amrex::Abort_host("solver_type sparse_direct requires the KLU library");
        bVar3 = true;
        if (0 < (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.
                verbose) {
          poVar5 = amrex::OutStream();
          amrex::Print::Print(&local_210,poVar5);
          std::operator<<((ostream *)&local_210.ss,
                          " Using a sparse direct linear solve with KLU Analytical Jacobian\n");
          amrex::Print::~Print(&local_210);
        }
        bVar4 = false;
      }
      HP = (int)(this->m_reactor_type == 2);
      if (!bVar4) {
        if (bVar3) {
          amrex::Abort_host(
                           "solver_type \'sparseDirect\' uses a sparse KLU matrix and requires the KLU library"
                           );
        }
        goto LAB_001b2dde;
      }
      SPARSITY_INFO_SYST((int *)&prec_type_str,&HP,1);
      if ((this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose <
          1) goto LAB_001b2dde;
      poVar5 = amrex::OutStream();
      amrex::Print::Print(&local_210,poVar5);
      poVar2 = &local_210.ss;
      std::operator<<((ostream *)poVar2,
                      "--> sparse AJ-based matrix custom Solver -- non zero entries: ");
      std::ostream::operator<<(poVar2,(uint)prec_type_str._M_dataplus._M_p);
      std::operator<<((ostream *)poVar2,", which represents ");
      std::ostream::_M_insert<double>
                (((double)(int)(uint)prec_type_str._M_dataplus._M_p / 484.0) * 100.0);
      std::operator<<((ostream *)poVar2," % fill-in pattern\n");
    }
  }
LAB_001b2dd4:
  amrex::Print::~Print(&local_210);
LAB_001b2dde:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ppcv);
  std::__cxx11::string::~string((string *)&solve_type_str);
  return;
}

Assistant:

void
ReactorCvode::checkCvodeOptions() const
{
  if (verbose > 0) {
    amrex::Print() << "Number of species in mech is " << NUM_SPECIES << "\n";
  }

  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  ppcv.query("solve_type", solve_type_str);
  int solve_type = -1;
  int analytical_jacobian = 0;
  int precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a cuSparse direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'sparse_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
#ifdef AMREX_USE_CUDA
    if (verbose > 0)
      amrex::Print()
        << " Using a custom direct linear solve with analytical Jacobian\n";
#else
    amrex::Abort("solve_type 'custom_direct' only available with CUDA");
#endif
  } else if (solve_type_str == "magma_direct") {
    solve_type = cvode::magmaDirect;
    analytical_jacobian = 1;
#ifdef PELE_USE_MAGMA
    if (verbose > 0)
      amrex::Print() << " Using MAGMA direct linear solve\n";
#else
    amrex::Abort(
      "solve_type 'magma_direct' only available with if PELE_USE_MAGMA true");
#endif
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0)
      amrex::Print() << " Using a JFNK GMRES linear solve";
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifdef AMREX_USE_CUDA
      amrex::Print() << " with a cuSparse simplified AJ-based preconditioner";
#else
      amrex::Abort(
        "precond_type 'cuSparse_simplified_AJacobian' only available with "
        "CUDA");
#endif
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    solve_type = cvode::fixedPoint;
    analytical_jacobian = 0;
    if (verbose > 0)
      amrex::Print() << " Using a fixed-point nonlinear solver\n";
  } else if (solve_type_str == "dense_direct") {
    solve_type = cvode::denseFDDirect;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Finite Difference "
           "Jacobian\n";
    }
  } else if (solve_type_str == "denseAJ_direct") {
    solve_type = cvode::denseDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a dense direct linear solve with Analytical Jacobian\n";
    }
  } else if (solve_type_str == "sparse_direct") {
    solve_type = cvode::sparseDirect;
    analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse direct linear solve with KLU Analytical Jacobian\n";
    }
  } else if (solve_type_str == "custom_direct") {
    solve_type = cvode::customDirect;
    analytical_jacobian = 1;
    if (verbose > 0) {
      amrex::Print()
        << " Using a sparse custom direct linear solve with Analytical "
           "Jacobian\n";
    }
  } else if (solve_type_str == "GMRES") {
    solve_type = cvode::GMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve\n";
    }
  } else if (solve_type_str == "precGMRES") {
    solve_type = cvode::precGMRES;
    if (verbose > 0) {
      amrex::Print() << " Using a JFNK GMRES linear solve";
    }
    std::string prec_type_str = "none";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      precond_type = cvode::denseSimpleAJac;
      amrex::Print() << " with a dense simplified AJ-based preconditioner";
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
      amrex::Print() << " with a sparse simplified AJ-based preconditioner";
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      precond_type = cvode::customSimpleAJac;
      amrex::Print() << " with a custom simplified AJ-based preconditioner";
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else if (solve_type_str == "diagnostic") {
    solve_type = cvode::hackDumpSparsePattern;
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Print additionnal information
  if (precond_type == cvode::sparseSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
#ifdef AMREX_USE_GPU
#if defined(AMREX_USE_CUDA)
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> cuSparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#elif defined(AMREX_USE_HIP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "HIP \n");
#elif defined(AMREX_USE_DPCPP)
    amrex::Abort(
      "\n--> precond_type sparse simplified_AJacobian not available with "
      "DPCPP \n");
#endif

#else
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> KLU sparse AJ based matrix Preconditioner -- non zero entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
#ifndef AMREX_USE_GPU
  } else if (precond_type == cvode::customSimpleAJac) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    // Simplified AJ precond data
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    if (verbose > 0) {
      amrex::Print()
        << "--> custom sparse AJ based matrix Preconditioner -- non zero "
           "entries: "
        << nJdata << ", which represents "
        << static_cast<amrex::Real>(nJdata) /
             static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
             100.0
        << " % fill-in pattern\n";
    }
#endif
  }

  if (analytical_jacobian == 1) {
    int nJdata;
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
    int ncells = 1; // Print the pattern of the diagonal block. ncells will
                    // actually vary on GPU.
#ifdef AMREX_USE_GPU
    if (solve_type == cvode::sparseDirect) {
#if defined(AMREX_USE_CUDA)
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> cuSparse based matrix Solver -- non zero entries: " << nJdata
          << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#elif defined(AMREX_USE_HIP)
      amrex::Abort("\n--> Analytical Jacobian not available with HIP. Change "
                   "solve_type.\n");
#elif defined(AMREX_USE_DPCPP)
      amrex::Abort("\n--> Analytical Jacobian not available with DPCPP. Change "
                   "solve_type.\n");
#endif
    }

#else
    if (solve_type == cvode::customDirect) {
      SPARSITY_INFO_SYST(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> sparse AJ-based matrix custom Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
    } else if (solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      SPARSITY_INFO(&nJdata, &HP, ncells);
      if (verbose > 0) {
        amrex::Print()
          << "--> KLU sparse AJ-based matrix Solver -- non zero entries: "
          << nJdata << ", which represents "
          << static_cast<amrex::Real>(nJdata) /
               static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
               100.0
          << " % fill-in pattern\n";
      }
#else
      amrex::Abort(
        "solver_type 'sparseDirect' uses a sparse KLU matrix and requires "
        "the KLU library");
#endif
    }
#endif
  }

#ifndef AMREX_USE_GPU
  if (solve_type == cvode::hackDumpSparsePattern) {
    // This is a diagnostic option -> dump sparsity pattern and abort.
    // Reactor type
    const int HP =
      static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);

    // CHEMISTRY JAC
    int nJdata = 0;
    SPARSITY_INFO(&nJdata, &HP, 1);
    amrex::Print() << "--> Chem. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    SUNMatrix PS;
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    auto* rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    auto* colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_CSR(colIdx, rowCount, &HP, 1, 0);
    amrex::Print()
      << "\n\n *** Treating CHEM Jac (CSR symbolic analysis)*** \n\n";
    int counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + rowCount[i], nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx]) && (nbVals > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC
    SPARSITY_INFO_SYST(&nJdata, &HP, 1);
    amrex::Print() << "--> Syst. Jac -- non zero entries: " << nJdata
                   << ", which represents "
                   << static_cast<amrex::Real>(nJdata) /
                        static_cast<amrex::Real>(
                          (NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
                        100.0
                   << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_CSR(colIdx, rowCount, &HP, 1, 1);
    amrex::Print()
      << "\n\n *** Treating SYST Jac (CSR symbolic analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    // SYST JAC SIMPLIFIED
    SPARSITY_INFO_SYST_SIMPLIFIED(&nJdata, &HP);
    amrex::Print()
      << "--> Simplified Syst Jac (for Precond) -- non zero entries: " << nJdata
      << ", which represents "
      << static_cast<amrex::Real>(nJdata) /
           static_cast<amrex::Real>((NUM_SPECIES + 1) * (NUM_SPECIES + 1)) *
           100.0
      << " % fill-in pattern\n";
    PS = SUNSparseMatrix(
      (NUM_SPECIES + 1), (NUM_SPECIES + 1), nJdata, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    rowCount = static_cast<int*>(SUNSparseMatrix_IndexPointers(PS));
    colIdx = static_cast<int*>(SUNSparseMatrix_IndexValues(PS));
    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(colIdx, rowCount, &HP, 1);
    amrex::Print() << "\n\n *** Treating simplified SYST Jac (CSR symbolic "
                      "analysis)*** \n\n";
    counter = 0;
    for (int i = 0; i < NUM_SPECIES + 1; i++) {
      int nbVals = rowCount[i + 1] - rowCount[i];
      int* idx_arr = new int[nbVals];
      std::fill_n(idx_arr, nbVals, -1);
      std::memcpy(idx_arr, colIdx + (rowCount[i] - 1), nbVals * sizeof(int));
      int idx = 0;
      for (int j = 0; j < NUM_SPECIES + 1; j++) {
        if ((j == idx_arr[idx] - 1) && ((nbVals - idx) > 0)) {
          std::cout << 1 << " ";
          idx = idx + 1;
          counter = counter + 1;
        } else {
          std::cout << 0 << " ";
        }
      }
      delete[] idx_arr;
      std::cout << std::endl;
    }
    amrex::Print() << " There was " << counter
                   << " non zero elems (compared to the " << nJdata
                   << " we need) \n";

    amrex::Abort("Chemistry sparsity pattern dumped -> exiting now !");
  }
#endif
}